

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

string * __thiscall
ot::commissioner::Interpreter::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Interpreter *this,BorderAgent *aBorderAgent)

{
  char cVar1;
  uint uVar2;
  BorderAgent *extraout_RDX;
  BorderAgent *extraout_RDX_00;
  ByteArray *aBytes;
  BorderAgent *extraout_RDX_01;
  BorderAgent *extraout_RDX_02;
  ByteArray *aBytes_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator local_69;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = *(uint *)&this[1].mThreadAdministratorPasscode.field_2;
  if ((uVar2 & 1) != 0) {
    std::__cxx11::string::string((string *)&local_90,"Addr=",(allocator *)&local_68);
    std::operator+(&local_d0,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(this->mContext).mNwkAliases.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
    std::operator+(&local_b0,&local_d0,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    uVar2 = *(uint *)&this[1].mThreadAdministratorPasscode.field_2;
    aBorderAgent = extraout_RDX;
  }
  if ((uVar2 & 2) != 0) {
    std::__cxx11::string::string((string *)&local_90,"Port=",(allocator *)&local_48);
    std::__cxx11::to_string
              (&local_68,
               (uint)*(ushort *)
                      &(this->mContext).mDomAliases.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator+(&local_d0,&local_90,&local_68);
    std::operator+(&local_b0,&local_d0,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_90);
    uVar2 = *(uint *)&this[1].mThreadAdministratorPasscode.field_2;
    aBorderAgent = extraout_RDX_00;
  }
  if ((short)uVar2 < 0) {
    std::__cxx11::string::string((string *)&local_90,"Discriminator=",(allocator *)&local_48);
    utils::Hex_abi_cxx11_(&local_68,(utils *)&(this->mContext).mExportFiles,aBytes);
    std::operator+(&local_d0,&local_90,&local_68);
    std::operator+(&local_b0,&local_d0,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_90);
    uVar2 = *(uint *)&this[1].mThreadAdministratorPasscode.field_2;
    aBorderAgent = extraout_RDX_01;
  }
  if ((uVar2 & 4) != 0) {
    std::__cxx11::string::string((string *)&local_90,"ThreadVersion=",(allocator *)&local_68);
    std::operator+(&local_d0,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(this->mContext).mImportFiles);
    std::operator+(&local_b0,&local_d0,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    uVar2 = *(uint *)&this[1].mThreadAdministratorPasscode.field_2;
    aBorderAgent = extraout_RDX_02;
  }
  if ((uVar2 & 8) != 0) {
    ToString_abi_cxx11_(&local_d0,
                        (Interpreter *)
                        &(this->mContext).mCommandKeys.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(State *)aBorderAgent);
    std::operator+(&local_b0,&local_d0,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    uVar2 = *(uint *)&this[1].mThreadAdministratorPasscode.field_2;
  }
  if ((uVar2 & 0x10) != 0) {
    std::__cxx11::string::string((string *)&local_90,"NetworkName=",(allocator *)&local_68);
    std::operator+(&local_d0,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(this->mContext).mCommandKeys.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator+(&local_b0,&local_d0,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    uVar2 = *(uint *)&this[1].mThreadAdministratorPasscode.field_2;
  }
  if ((uVar2 & 0x20) != 0) {
    std::__cxx11::string::string((string *)&local_68,"ExtendedPanId=",&local_69);
    utils::Encode<unsigned_long>
              ((ByteArray *)&local_28,
               (unsigned_long)
               (this->mRegistry).
               super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    utils::Hex_abi_cxx11_(&local_b0,(utils *)&local_28,aBytes_00);
    std::operator+(&local_48,"0x",&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
    std::operator+(&local_90,&local_68,&local_48);
    std::operator+(&local_d0,&local_90,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    uVar2 = *(uint *)&this[1].mThreadAdministratorPasscode.field_2;
  }
  cVar1 = (char)uVar2;
  if ((uVar2 & 0x40) != 0) {
    std::__cxx11::string::string((string *)&local_90,"VendorName=",(allocator *)&local_68);
    std::operator+(&local_d0,&local_90,&this->mThreadAdministratorPasscode);
    std::operator+(&local_b0,&local_d0,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    cVar1 = (char)*(undefined4 *)&this[1].mThreadAdministratorPasscode.field_2;
  }
  if (cVar1 < '\0') {
    std::__cxx11::string::string((string *)&local_90,"ModelName=",(allocator *)&local_68);
    std::operator+(&local_d0,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &this->mShouldExit);
    std::operator+(&local_b0,&local_d0,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::ToString(const BorderAgent &aBorderAgent)
{
    std::string ret;

#define BUILD_STRING(name, nameStr)                             \
    if (aBorderAgent.mPresentFlags & BorderAgent::k##name##Bit) \
    {                                                           \
        ret += std::string(#name "=") + nameStr + "\n";         \
    };

    BUILD_STRING(Addr, aBorderAgent.mAddr);
    BUILD_STRING(Port, std::to_string(aBorderAgent.mPort));
    BUILD_STRING(Discriminator, utils::Hex(aBorderAgent.mDiscriminator));
    BUILD_STRING(ThreadVersion, aBorderAgent.mThreadVersion);
    if (aBorderAgent.mPresentFlags & BorderAgent::kStateBit)
    {
        ret += ToString(aBorderAgent.mState) + "\n";
    }
    BUILD_STRING(NetworkName, aBorderAgent.mNetworkName);
    BUILD_STRING(ExtendedPanId, ToHex(aBorderAgent.mExtendedPanId));
    BUILD_STRING(VendorName, aBorderAgent.mVendorName);
    BUILD_STRING(ModelName, aBorderAgent.mModelName);

    // TODO(wgtdkp): more fields

#undef TO_STRING

    return ret;
}